

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O0

int apply_patch(cJSON *object,cJSON *patch,cJSON_bool case_sensitive)

{
  cJSON replacement;
  undefined1 auVar1 [40];
  cJSON replacement_00;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  cJSON_bool cVar6;
  patch_operation pVar7;
  int iVar8;
  cJSON *pcVar9;
  int in_EDX;
  long in_RDI;
  size_t index;
  cJSON *from;
  cJSON *old_item;
  int status;
  uchar *child_pointer;
  uchar *parent_pointer;
  patch_operation opcode;
  cJSON *parent;
  cJSON *value;
  cJSON *path;
  cJSON *in_stack_ffffffffffffff48;
  cJSON *in_stack_ffffffffffffff50;
  cJSON *in_stack_ffffffffffffff58;
  cJSON *in_stack_ffffffffffffff60;
  cJSON *in_stack_ffffffffffffff68;
  cJSON_bool in_stack_ffffffffffffff74;
  cJSON *in_stack_ffffffffffffff78;
  cJSON *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  uint local_4c;
  uchar *local_48;
  uchar *local_40;
  cJSON *local_28;
  
  local_28 = (cJSON *)0x0;
  local_40 = (uchar *)0x0;
  local_4c = 0;
  pcVar9 = get_object_item(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                           (cJSON_bool)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  cVar6 = cJSON_IsString(pcVar9);
  if (cVar6 == 0) {
    local_4c = 2;
  }
  else {
    pVar7 = decode_patch_operation
                      (in_stack_ffffffffffffff58,
                       (cJSON_bool)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    if (pVar7 == INVALID) {
      local_4c = 3;
    }
    else if (pVar7 == TEST) {
      get_item_from_pointer
                (in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60,
                 (cJSON_bool)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      get_object_item(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                      (cJSON_bool)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      cVar6 = compare_json(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                           (cJSON_bool)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      local_4c = (uint)((cVar6 != 0 ^ 0xffU) & 1);
    }
    else {
      if (*pcVar9->valuestring == '\0') {
        if (pVar7 == REMOVE) {
          in_stack_ffffffffffffff50 = (cJSON *)0x0;
          auVar1 = ZEXT1640(ZEXT816(0));
          replacement._40_8_ = in_stack_ffffffffffffff88;
          replacement.next = (cJSON *)auVar1._0_8_;
          replacement.prev = (cJSON *)auVar1._8_8_;
          replacement.child = (cJSON *)auVar1._16_8_;
          replacement.type = auVar1._24_4_;
          replacement._28_4_ = auVar1._28_4_;
          replacement.valuestring = (char *)auVar1._32_8_;
          replacement.valuedouble = (double)in_stack_ffffffffffffff90;
          replacement.string = in_stack_ffffffffffffff98;
          overwrite_item((cJSON *)0x0,replacement);
          local_4c = 0;
          goto LAB_00106c87;
        }
        if ((pVar7 == REPLACE) || (pVar7 == ADD)) {
          pcVar9 = get_object_item(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                                   (cJSON_bool)((ulong)in_stack_ffffffffffffff48 >> 0x20));
          if (pcVar9 == (cJSON *)0x0) {
            local_4c = 7;
            local_28 = (cJSON *)0x0;
          }
          else {
            pcVar9 = cJSON_Duplicate(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
            if (pcVar9 == (cJSON *)0x0) {
              local_4c = 8;
              local_28 = (cJSON *)0x0;
            }
            else {
              in_stack_ffffffffffffff50 = pcVar9->prev;
              uVar2 = pcVar9->type;
              uVar3 = *(undefined4 *)&pcVar9->field_0x1c;
              uVar4 = pcVar9->valuestring;
              uVar5 = pcVar9->valueint;
              replacement_00.child._0_4_ = uVar5;
              replacement_00.prev = (cJSON *)uVar4;
              replacement_00.next._4_4_ = uVar3;
              replacement_00.next._0_4_ = uVar2;
              replacement_00.child._4_4_ = (int)((ulong)*(undefined8 *)&pcVar9->valueint >> 0x20);
              replacement_00._24_8_ = pcVar9->valuedouble;
              replacement_00.valuestring = pcVar9->string;
              replacement_00._40_8_ = in_stack_ffffffffffffff88;
              replacement_00.valuedouble = (double)in_stack_ffffffffffffff90;
              replacement_00.string = in_stack_ffffffffffffff98;
              overwrite_item(in_stack_ffffffffffffff50,replacement_00);
              cJSON_free((void *)0x1068aa);
              local_28 = (cJSON *)0x0;
              if (*(long *)(in_RDI + 0x38) != 0) {
                cJSON_free((void *)0x1068d6);
                *(undefined8 *)(in_RDI + 0x38) = 0;
              }
              local_4c = 0;
            }
          }
          goto LAB_00106c87;
        }
      }
      if ((pVar7 == REMOVE) || (pVar7 == REPLACE)) {
        pcVar9 = detach_path(in_stack_ffffffffffffff80,(uchar *)in_stack_ffffffffffffff78,
                             in_stack_ffffffffffffff74);
        if (pcVar9 == (cJSON *)0x0) {
          local_4c = 0xd;
          goto LAB_00106c87;
        }
        cJSON_Delete(in_stack_ffffffffffffff50);
        if (pVar7 == REMOVE) {
          local_4c = 0;
          goto LAB_00106c87;
        }
      }
      cVar6 = (cJSON_bool)((ulong)in_stack_ffffffffffffff48 >> 0x20);
      if ((pVar7 == MOVE) || (pVar7 == COPY)) {
        pcVar9 = get_object_item(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,cVar6);
        if (pcVar9 == (cJSON *)0x0) {
          local_4c = 4;
          goto LAB_00106c87;
        }
        if (pVar7 == MOVE) {
          local_28 = detach_path(in_stack_ffffffffffffff80,(uchar *)in_stack_ffffffffffffff78,
                                 in_stack_ffffffffffffff74);
        }
        if (pVar7 == COPY) {
          local_28 = get_item_from_pointer
                               (in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60,
                                (cJSON_bool)((ulong)in_stack_ffffffffffffff58 >> 0x20));
        }
        if (local_28 == (cJSON *)0x0) {
          local_4c = 5;
          goto LAB_00106c87;
        }
        if (pVar7 == COPY) {
          local_28 = cJSON_Duplicate(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
        }
        if (local_28 == (cJSON *)0x0) {
          local_4c = 6;
          goto LAB_00106c87;
        }
      }
      else {
        pcVar9 = get_object_item(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,cVar6);
        if (pcVar9 == (cJSON *)0x0) {
          local_4c = 7;
          local_28 = (cJSON *)0x0;
          goto LAB_00106c87;
        }
        local_28 = cJSON_Duplicate(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
        if (local_28 == (cJSON *)0x0) {
          local_4c = 8;
          goto LAB_00106c87;
        }
      }
      local_40 = cJSONUtils_strdup((uchar *)in_stack_ffffffffffffff58);
      local_48 = (uchar *)strrchr((char *)local_40,0x2f);
      if (local_48 != (uchar *)0x0) {
        *local_48 = '\0';
        local_48 = local_48 + 1;
      }
      pcVar9 = get_item_from_pointer
                         (in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60,
                          (cJSON_bool)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      decode_pointer_inplace(local_48);
      if ((pcVar9 == (cJSON *)0x0) || (local_48 == (uchar *)0x0)) {
        local_4c = 9;
      }
      else {
        cVar6 = cJSON_IsArray(pcVar9);
        if (cVar6 == 0) {
          cVar6 = cJSON_IsObject(pcVar9);
          if (cVar6 != 0) {
            if (in_EDX == 0) {
              cJSON_DeleteItemFromObject
                        (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
            }
            else {
              cJSON_DeleteItemFromObjectCaseSensitive
                        (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
            }
            cJSON_AddItemToObject
                      (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,
                       in_stack_ffffffffffffff50);
            local_28 = (cJSON *)0x0;
          }
        }
        else {
          iVar8 = strcmp((char *)local_48,"-");
          if (iVar8 == 0) {
            cJSON_AddItemToArray(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          }
          else {
            cVar6 = decode_array_index_from_pointer(local_48,(size_t *)&stack0xffffffffffffff98);
            if (cVar6 == 0) {
              local_4c = 0xb;
              goto LAB_00106c87;
            }
            cVar6 = insert_item_in_array
                              (in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60,
                               in_stack_ffffffffffffff58);
            if (cVar6 == 0) {
              local_4c = 10;
              goto LAB_00106c87;
            }
          }
          local_28 = (cJSON *)0x0;
        }
      }
    }
  }
LAB_00106c87:
  if (local_28 != (cJSON *)0x0) {
    cJSON_Delete(in_stack_ffffffffffffff50);
  }
  if (local_40 != (uchar *)0x0) {
    cJSON_free((void *)0x106cb1);
  }
  return local_4c;
}

Assistant:

static int apply_patch(cJSON *object, const cJSON *patch, const cJSON_bool case_sensitive)
{
    cJSON *path = NULL;
    cJSON *value = NULL;
    cJSON *parent = NULL;
    enum patch_operation opcode = INVALID;
    unsigned char *parent_pointer = NULL;
    unsigned char *child_pointer = NULL;
    int status = 0;

    path = get_object_item(patch, "path", case_sensitive);
    if (!cJSON_IsString(path))
    {
        /* malformed patch. */
        status = 2;
        goto cleanup;
    }

    opcode = decode_patch_operation(patch, case_sensitive);
    if (opcode == INVALID)
    {
        status = 3;
        goto cleanup;
    }
    else if (opcode == TEST)
    {
        /* compare value: {...} with the given path */
        status = !compare_json(get_item_from_pointer(object, path->valuestring, case_sensitive), get_object_item(patch, "value", case_sensitive), case_sensitive);
        goto cleanup;
    }

    /* special case for replacing the root */
    if (path->valuestring[0] == '\0')
    {
        if (opcode == REMOVE)
        {
            static const cJSON invalid = { NULL, NULL, NULL, cJSON_Invalid, NULL, 0, 0, NULL};

            overwrite_item(object, invalid);

            status = 0;
            goto cleanup;
        }

        if ((opcode == REPLACE) || (opcode == ADD))
        {
            value = get_object_item(patch, "value", case_sensitive);
            if (value == NULL)
            {
                /* missing "value" for add/replace. */
                status = 7;
                goto cleanup;
            }

            value = cJSON_Duplicate(value, 1);
            if (value == NULL)
            {
                /* out of memory for add/replace. */
                status = 8;
                goto cleanup;
            }

            overwrite_item(object, *value);

            /* delete the duplicated value */
            cJSON_free(value);
            value = NULL;

            /* the string "value" isn't needed */
            if (object->string != NULL)
            {
                cJSON_free(object->string);
                object->string = NULL;
            }

            status = 0;
            goto cleanup;
        }
    }

    if ((opcode == REMOVE) || (opcode == REPLACE))
    {
        /* Get rid of old. */
        cJSON *old_item = detach_path(object, (unsigned char*)path->valuestring, case_sensitive);
        if (old_item == NULL)
        {
            status = 13;
            goto cleanup;
        }
        cJSON_Delete(old_item);
        if (opcode == REMOVE)
        {
            /* For Remove, this job is done. */
            status = 0;
            goto cleanup;
        }
    }

    /* Copy/Move uses "from". */
    if ((opcode == MOVE) || (opcode == COPY))
    {
        cJSON *from = get_object_item(patch, "from", case_sensitive);
        if (from == NULL)
        {
            /* missing "from" for copy/move. */
            status = 4;
            goto cleanup;
        }

        if (opcode == MOVE)
        {
            value = detach_path(object, (unsigned char*)from->valuestring, case_sensitive);
        }
        if (opcode == COPY)
        {
            value = get_item_from_pointer(object, from->valuestring, case_sensitive);
        }
        if (value == NULL)
        {
            /* missing "from" for copy/move. */
            status = 5;
            goto cleanup;
        }
        if (opcode == COPY)
        {
            value = cJSON_Duplicate(value, 1);
        }
        if (value == NULL)
        {
            /* out of memory for copy/move. */
            status = 6;
            goto cleanup;
        }
    }
    else /* Add/Replace uses "value". */
    {
        value = get_object_item(patch, "value", case_sensitive);
        if (value == NULL)
        {
            /* missing "value" for add/replace. */
            status = 7;
            goto cleanup;
        }
        value = cJSON_Duplicate(value, 1);
        if (value == NULL)
        {
            /* out of memory for add/replace. */
            status = 8;
            goto cleanup;
        }
    }

    /* Now, just add "value" to "path". */

    /* split pointer in parent and child */
    parent_pointer = cJSONUtils_strdup((unsigned char*)path->valuestring);
    child_pointer = (unsigned char*)strrchr((char*)parent_pointer, '/');
    if (child_pointer != NULL)
    {
        child_pointer[0] = '\0';
        child_pointer++;
    }
    parent = get_item_from_pointer(object, (char*)parent_pointer, case_sensitive);
    decode_pointer_inplace(child_pointer);

    /* add, remove, replace, move, copy, test. */
    if ((parent == NULL) || (child_pointer == NULL))
    {
        /* Couldn't find object to add to. */
        status = 9;
        goto cleanup;
    }
    else if (cJSON_IsArray(parent))
    {
        if (strcmp((char*)child_pointer, "-") == 0)
        {
            cJSON_AddItemToArray(parent, value);
            value = NULL;
        }
        else
        {
            size_t index = 0;
            if (!decode_array_index_from_pointer(child_pointer, &index))
            {
                status = 11;
                goto cleanup;
            }

            if (!insert_item_in_array(parent, index, value))
            {
                status = 10;
                goto cleanup;
            }
            value = NULL;
        }
    }
    else if (cJSON_IsObject(parent))
    {
        if (case_sensitive)
        {
            cJSON_DeleteItemFromObjectCaseSensitive(parent, (char*)child_pointer);
        }
        else
        {
            cJSON_DeleteItemFromObject(parent, (char*)child_pointer);
        }
        cJSON_AddItemToObject(parent, (char*)child_pointer, value);
        value = NULL;
    }

cleanup:
    if (value != NULL)
    {
        cJSON_Delete(value);
    }
    if (parent_pointer != NULL)
    {
        cJSON_free(parent_pointer);
    }

    return status;
}